

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLFormulasLoader15.cpp
# Opt level: O2

bool __thiscall
COLLADASaxFWL::FormulasLoader15::begin__lcm
          (FormulasLoader15 *this,lcm__AttributeData *attributeData)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  lcm__AttributeData local_230;
  
  lcm__AttributeData::lcm__AttributeData(&local_230);
  local_230.style = attributeData->style;
  local_230.xref = attributeData->xref;
  local_230.id = attributeData->id;
  local_230.encoding = attributeData->encoding;
  local_230.unknownAttributes.data = (attributeData->unknownAttributes).data;
  local_230.unknownAttributes.size = (attributeData->unknownAttributes).size;
  local_230.present_attributes = 0;
  uVar1 = attributeData->present_attributes;
  if ((uVar1 & 1) == 0) {
    uVar3 = 2;
  }
  else {
    COLLADABU::URI::operator=(&local_230.definitionURL,&attributeData->definitionURL);
    uVar1 = attributeData->present_attributes;
    uVar3 = local_230.present_attributes | 3;
    local_230.present_attributes = local_230.present_attributes | 1;
  }
  if ((uVar1 & 2) != 0) {
    local_230._class.data = (attributeData->_class).data;
    local_230._class.size = (attributeData->_class).size;
    local_230.present_attributes = uVar3;
  }
  if ((uVar1 & 4) != 0) {
    COLLADABU::URI::operator=(&local_230.href,&attributeData->href);
    local_230.present_attributes = local_230.present_attributes | 4;
  }
  iVar2 = (*(this->mLoader->super_HelperLoaderBase)._vptr_HelperLoaderBase[0x68])
                    (this->mLoader,&local_230);
  lcm__AttributeData::~lcm__AttributeData(&local_230);
  return SUB41(iVar2,0);
}

Assistant:

bool FormulasLoader15::begin__lcm( const COLLADASaxFWL15::lcm__AttributeData& attributeData )
{
SaxVirtualFunctionTest15(begin__lcm(attributeData));
COLLADASaxFWL::lcm__AttributeData attrData;
attrData.style = attributeData.style;
attrData.xref = attributeData.xref;
attrData.id = attributeData.id;
attrData.encoding = attributeData.encoding;
attrData.unknownAttributes = attributeData.unknownAttributes;
attrData.present_attributes = 0;
if ( (attributeData.present_attributes & COLLADASaxFWL15::lcm__AttributeData::ATTRIBUTE_DEFINITIONURL_PRESENT) == COLLADASaxFWL15::lcm__AttributeData::ATTRIBUTE_DEFINITIONURL_PRESENT ) {
    attrData.definitionURL = attributeData.definitionURL;
    attrData.present_attributes |= COLLADASaxFWL::lcm__AttributeData::ATTRIBUTE_DEFINITIONURL_PRESENT;
}
if ( (attributeData.present_attributes & COLLADASaxFWL15::lcm__AttributeData::ATTRIBUTE__CLASS_PRESENT) == COLLADASaxFWL15::lcm__AttributeData::ATTRIBUTE__CLASS_PRESENT ) {
    attrData._class = attributeData._class;
    attrData.present_attributes |= COLLADASaxFWL::lcm__AttributeData::ATTRIBUTE__CLASS_PRESENT;
}
if ( (attributeData.present_attributes & COLLADASaxFWL15::lcm__AttributeData::ATTRIBUTE_HREF_PRESENT) == COLLADASaxFWL15::lcm__AttributeData::ATTRIBUTE_HREF_PRESENT ) {
    attrData.href = attributeData.href;
    attrData.present_attributes |= COLLADASaxFWL::lcm__AttributeData::ATTRIBUTE_HREF_PRESENT;
}
return mLoader->begin__lcm(attrData);
}